

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.cpp
# Opt level: O2

void wallet::PushParentDescriptors(CWallet *wallet,CScript *script_pubkey,UniValue *entry)

{
  long lVar1;
  element_type *peVar2;
  string str;
  string key;
  UniValue val;
  UniValue val_00;
  long in_FS_OFFSET;
  pointer in_stack_fffffffffffffe48;
  pointer pWVar3;
  pointer in_stack_fffffffffffffe50;
  pointer pWVar4;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  in_stack_fffffffffffffe58;
  undefined1 auVar5 [32];
  undefined1 in_stack_fffffffffffffe68 [56];
  undefined1 in_stack_fffffffffffffea0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_128;
  UniValue local_108;
  undefined1 *local_b0;
  undefined8 local_a8;
  undefined1 local_a0 [16];
  UniValue parent_descs;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  local_b0 = local_a0;
  local_a8 = 0;
  local_a0[0] = 0;
  str._M_string_length = (size_type)in_stack_fffffffffffffe50;
  str._M_dataplus._M_p = (pointer)in_stack_fffffffffffffe48;
  str.field_2 = in_stack_fffffffffffffe58;
  UniValue::UniValue(&parent_descs,VARR,str);
  std::__cxx11::string::~string((string *)&local_b0);
  CWallet::GetWalletDescriptors
            ((vector<wallet::WalletDescriptor,_std::allocator<wallet::WalletDescriptor>_> *)
             &stack0xfffffffffffffe48,wallet,script_pubkey);
  pWVar3 = in_stack_fffffffffffffe48;
  pWVar4 = in_stack_fffffffffffffe50;
  for (; in_stack_fffffffffffffe48 != in_stack_fffffffffffffe50;
      in_stack_fffffffffffffe48 = in_stack_fffffffffffffe48 + 1) {
    peVar2 = (in_stack_fffffffffffffe48->descriptor).
             super___shared_ptr<Descriptor,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    (*peVar2->_vptr_Descriptor[4])(&local_128,peVar2,0);
    UniValue::
    UniValue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
              (&local_108,&local_128);
    val.val._M_dataplus._M_p = (pointer)pWVar4;
    val._0_8_ = pWVar3;
    val.val._8_16_ = in_stack_fffffffffffffe58;
    val._32_56_ = in_stack_fffffffffffffe68;
    UniValue::push_back(&parent_descs,val);
    UniValue::~UniValue(&local_108);
    std::__cxx11::string::~string((string *)&local_128);
  }
  std::vector<wallet::WalletDescriptor,_std::allocator<wallet::WalletDescriptor>_>::~vector
            ((vector<wallet::WalletDescriptor,_std::allocator<wallet::WalletDescriptor>_> *)
             &stack0xfffffffffffffe48);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&stack0xfffffffffffffeb8,"parent_descs",(allocator<char> *)&local_128);
  UniValue::UniValue((UniValue *)&stack0xfffffffffffffe60,&parent_descs);
  key._M_string_length = (size_type)pWVar4;
  key._M_dataplus._M_p = (pointer)pWVar3;
  key.field_2 = in_stack_fffffffffffffe58;
  val_00.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)in_stack_fffffffffffffea0._0_8_;
  val_00.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data =
       (_Vector_base<UniValue,_std::allocator<UniValue>_>)
       (_Vector_base<UniValue,_std::allocator<UniValue>_>)in_stack_fffffffffffffea0._8_24_;
  auVar5 = in_stack_fffffffffffffe68._8_32_;
  val_00.typ = in_stack_fffffffffffffe68._0_4_;
  val_00._4_4_ = in_stack_fffffffffffffe68._4_4_;
  val_00.val._M_dataplus._M_p = (pointer)auVar5._0_8_;
  val_00.val._M_string_length = auVar5._8_8_;
  val_00.val.field_2 =
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        )auVar5._16_16_;
  val_00.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)in_stack_fffffffffffffe68._40_8_;
  val_00.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)in_stack_fffffffffffffe68._48_8_;
  UniValue::pushKV(entry,key,val_00);
  UniValue::~UniValue((UniValue *)&stack0xfffffffffffffe60);
  std::__cxx11::string::~string((string *)&stack0xfffffffffffffeb8);
  UniValue::~UniValue(&parent_descs);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void PushParentDescriptors(const CWallet& wallet, const CScript& script_pubkey, UniValue& entry)
{
    UniValue parent_descs(UniValue::VARR);
    for (const auto& desc: wallet.GetWalletDescriptors(script_pubkey)) {
        parent_descs.push_back(desc.descriptor->ToString());
    }
    entry.pushKV("parent_descs", std::move(parent_descs));
}